

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.cc
# Opt level: O0

void tcmalloc::ThreadCache::GetThreadStats(uint64_t *total_bytes,uint64_t *class_count)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  uint local_24;
  ThreadCache *pTStack_20;
  int cl;
  ThreadCache *h;
  uint64_t *class_count_local;
  uint64_t *total_bytes_local;
  
  for (pTStack_20 = thread_heaps_; pTStack_20 != (ThreadCache *)0x0; pTStack_20 = pTStack_20->next_)
  {
    sVar3 = Size(pTStack_20);
    *total_bytes = sVar3 + *total_bytes;
    if (class_count != (uint64_t *)0x0) {
      for (local_24 = 0; uVar1 = Static::num_size_classes(), local_24 < uVar1;
          local_24 = local_24 + 1) {
        iVar2 = freelist_length(pTStack_20,local_24);
        class_count[(int)local_24] = (long)iVar2 + class_count[(int)local_24];
      }
    }
  }
  return;
}

Assistant:

void ThreadCache::GetThreadStats(uint64_t* total_bytes, uint64_t* class_count) {
  for (ThreadCache* h = thread_heaps_; h != nullptr; h = h->next_) {
    *total_bytes += h->Size();
    if (class_count) {
      for (int cl = 0; cl < Static::num_size_classes(); ++cl) {
        class_count[cl] += h->freelist_length(cl);
      }
    }
  }
}